

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

bool __thiscall wirehair::Codec::TriangleNonHeavy(Codec *this)

{
  ulong uVar1;
  ulong *puVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t *puVar6;
  uint16_t *puVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  
  uVar12 = this->_next_pivot;
  uVar13 = (ulong)uVar12;
  uVar4 = this->_first_heavy_column;
  bVar24 = uVar4 <= uVar12;
  if (!bVar24) {
    uVar12 = this->_pivot_count;
    uVar16 = 1L << (uVar13 & 0x3f);
    puVar6 = this->_ge_matrix;
    puVar7 = this->_pivots;
    uVar5 = this->_ge_pitch;
    uVar23 = uVar13;
    do {
      uVar1 = uVar23 + 1;
      if (uVar23 < uVar12) {
        uVar17 = (int)(uVar13 >> 6) << 3;
        uVar10 = uVar23 >> 6 & 0x3ffffff;
        uVar18 = uVar5 - (int)uVar10;
        bVar9 = false;
        uVar22 = uVar23 & 0xffffffff;
        uVar20 = uVar1;
        do {
          uVar3 = puVar7[uVar22];
          uVar11 = (ulong)(uVar5 * uVar3);
          uVar8 = puVar6[uVar10 + uVar11];
          if ((uVar8 & uVar16) != 0) {
            puVar7[uVar22] = puVar7[uVar23];
            puVar7[uVar23] = uVar3;
            bVar9 = true;
            if ((int)uVar22 + 1U < uVar12) {
              uVar19 = uVar20;
              do {
                uVar15 = (ulong)(puVar7[uVar19] * uVar5);
                if (((puVar6[uVar10 + uVar15] & uVar16) != 0) &&
                   (puVar6[uVar10 + uVar15] = puVar6[uVar10 + uVar15] ^ uVar8 & -uVar16 ^ uVar16,
                   1 < uVar18)) {
                  uVar14 = 1;
                  do {
                    puVar2 = (ulong *)((long)puVar6 + uVar14 * 8 + uVar15 * 8 + (ulong)uVar17);
                    *puVar2 = *puVar2 ^ *(ulong *)((long)puVar6 +
                                                  uVar14 * 8 + uVar11 * 8 + (ulong)uVar17);
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < uVar18);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < uVar12);
              bVar9 = true;
            }
          }
          if ((uVar8 & uVar16) != 0) break;
          uVar21 = (int)uVar22 + 1;
          uVar22 = (ulong)uVar21;
          uVar20 = uVar20 + 1;
        } while (uVar21 < uVar12);
      }
      else {
        bVar9 = false;
      }
      if (!bVar9) {
        this->_next_pivot = (uint)uVar23;
        return bVar24;
      }
      uVar16 = uVar16 >> 0x3f | uVar16 << 1;
      bVar24 = uVar4 <= uVar1;
      uVar13 = (ulong)((int)uVar13 + 1);
      uVar23 = uVar1;
    } while (uVar1 != uVar4);
    uVar12 = (uint)uVar1;
  }
  this->_next_pivot = uVar12;
  InsertHeavyRows(this);
  return bVar24;
}

Assistant:

bool Codec::TriangleNonHeavy()
{
    CAT_IF_DUMP(cout << endl << "---- TriangleNonHeavy ----" << endl << endl;)

    const unsigned pivot_count = _pivot_count;
    const unsigned first_heavy_column = _first_heavy_column;

    unsigned pivot_i = _next_pivot;
    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For the columns that are not protected by heavy rows:
    for (; pivot_i < first_heavy_column; ++pivot_i)
    {
        const unsigned word_offset = pivot_i >> 6;

        bool found = false;

        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;

        // For each remaining GE row that might be the pivot:
        for (unsigned pivot_j = pivot_i; pivot_j < pivot_count; ++pivot_j)
        {
            // Determine if the row contains the bit we want
            const unsigned ge_row_j = _pivots[pivot_j];

            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            // For each remaining unused row:
            for (unsigned pivot_k = pivot_j + 1; pivot_k < pivot_count; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                const unsigned ge_row_k = _pivots[pivot_k];

                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            break;
        }

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        // Generate next mask
        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    _next_pivot = pivot_i;

    InsertHeavyRows();

    return true;
}